

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_dr_flac *
ma_dr_flac_open_file_with_metadata
          (char *pFileName,ma_dr_flac_meta_proc onMeta,void *pUserData,
          ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_result mVar1;
  FILE *pFile;
  ma_dr_flac *pFlac;
  void *in_stack_00001240;
  void *in_stack_00001248;
  ma_dr_flac_container in_stack_00001254;
  ma_dr_flac_meta_proc in_stack_00001258;
  ma_dr_flac_seek_proc in_stack_00001260;
  ma_dr_flac_read_proc in_stack_00001268;
  ma_allocation_callbacks *in_stack_000012c0;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  FILE *in_stack_ffffffffffffffc8;
  ma_dr_flac *local_8;
  
  mVar1 = ma_fopen((FILE **)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                   in_stack_ffffffffffffffb8);
  if (mVar1 == MA_SUCCESS) {
    local_8 = ma_dr_flac_open_with_metadata_private
                        (in_stack_00001268,in_stack_00001260,in_stack_00001258,in_stack_00001254,
                         in_stack_00001248,in_stack_00001240,in_stack_000012c0);
    if (local_8 == (ma_dr_flac *)0x0) {
      fclose(in_stack_ffffffffffffffc8);
    }
  }
  else {
    local_8 = (ma_dr_flac *)0x0;
  }
  return local_8;
}

Assistant:

MA_API ma_dr_flac* ma_dr_flac_open_file_with_metadata(const char* pFileName, ma_dr_flac_meta_proc onMeta, void* pUserData, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_flac* pFlac;
    FILE* pFile;
    if (ma_fopen(&pFile, pFileName, "rb") != MA_SUCCESS) {
        return NULL;
    }
    pFlac = ma_dr_flac_open_with_metadata_private(ma_dr_flac__on_read_stdio, ma_dr_flac__on_seek_stdio, onMeta, ma_dr_flac_container_unknown, (void*)pFile, pUserData, pAllocationCallbacks);
    if (pFlac == NULL) {
        fclose(pFile);
        return pFlac;
    }
    return pFlac;
}